

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testLimits.cpp
# Opt level: O0

void testLimits(void)

{
  bool bVar1;
  ostream *this;
  float fVar2;
  __type_conflict _Var3;
  double dVar4;
  half h_7;
  half h_6;
  half h_5;
  half h_4;
  half h_3;
  half h_2;
  half h_1;
  half h;
  float in_stack_ffffffffffffffec;
  half *in_stack_fffffffffffffff0;
  
  std::operator<<((ostream *)&std::cout,"values in std::numeric_limits<half>\n");
  std::operator<<((ostream *)&std::cout,"min_exponent\n");
  anon_unknown.dwarf_c3ad1::mypow(2,-0xe);
  Imath_3_2::half::half(in_stack_fffffffffffffff0,in_stack_ffffffffffffffec);
  bVar1 = Imath_3_2::half::isNormalized(in_stack_fffffffffffffff0);
  if (!bVar1) {
    __assert_fail("h.isNormalized ()",
                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testLimits.cpp"
                  ,0x38,"void testLimits()");
  }
  anon_unknown.dwarf_c3ad1::mypow(2,-0xf);
  Imath_3_2::half::half(in_stack_fffffffffffffff0,in_stack_ffffffffffffffec);
  bVar1 = Imath_3_2::half::isDenormalized(in_stack_fffffffffffffff0);
  if (!bVar1) {
    __assert_fail("h.isDenormalized ()",
                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testLimits.cpp"
                  ,0x3d,"void testLimits()");
  }
  std::operator<<((ostream *)&std::cout,"max_exponent\n");
  anon_unknown.dwarf_c3ad1::mypow(2,0xf);
  Imath_3_2::half::half(in_stack_fffffffffffffff0,in_stack_ffffffffffffffec);
  bVar1 = Imath_3_2::half::isNormalized(in_stack_fffffffffffffff0);
  if (!bVar1) {
    __assert_fail("h.isNormalized ()",
                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testLimits.cpp"
                  ,0x44,"void testLimits()");
  }
  anon_unknown.dwarf_c3ad1::mypow(2,0x10);
  Imath_3_2::half::half(in_stack_fffffffffffffff0,in_stack_ffffffffffffffec);
  bVar1 = Imath_3_2::half::isInfinity(in_stack_fffffffffffffff0);
  if (!bVar1) {
    __assert_fail("h.isInfinity ()",
                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testLimits.cpp"
                  ,0x49,"void testLimits()");
  }
  std::operator<<((ostream *)&std::cout,"min_exponent10\n");
  anon_unknown.dwarf_c3ad1::mypow(10,-4);
  Imath_3_2::half::half(in_stack_fffffffffffffff0,in_stack_ffffffffffffffec);
  bVar1 = Imath_3_2::half::isNormalized(in_stack_fffffffffffffff0);
  if (!bVar1) {
    __assert_fail("h.isNormalized ()",
                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testLimits.cpp"
                  ,0x50,"void testLimits()");
  }
  anon_unknown.dwarf_c3ad1::mypow(10,-5);
  Imath_3_2::half::half(in_stack_fffffffffffffff0,in_stack_ffffffffffffffec);
  bVar1 = Imath_3_2::half::isDenormalized(in_stack_fffffffffffffff0);
  if (!bVar1) {
    __assert_fail("h.isDenormalized ()",
                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testLimits.cpp"
                  ,0x55,"void testLimits()");
  }
  std::operator<<((ostream *)&std::cout,"max_exponent10\n");
  anon_unknown.dwarf_c3ad1::mypow(10,4);
  Imath_3_2::half::half(in_stack_fffffffffffffff0,in_stack_ffffffffffffffec);
  bVar1 = Imath_3_2::half::isNormalized(in_stack_fffffffffffffff0);
  if (!bVar1) {
    __assert_fail("h.isNormalized ()",
                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testLimits.cpp"
                  ,0x5c,"void testLimits()");
  }
  anon_unknown.dwarf_c3ad1::mypow(10,5);
  Imath_3_2::half::half(in_stack_fffffffffffffff0,in_stack_ffffffffffffffec);
  bVar1 = Imath_3_2::half::isInfinity(in_stack_fffffffffffffff0);
  if (!bVar1) {
    __assert_fail("h.isInfinity ()",
                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testLimits.cpp"
                  ,0x61,"void testLimits()");
  }
  std::operator<<((ostream *)&std::cout,"max_digits10\n");
  _Var3 = std::log10<int>(0);
  dVar4 = ceil(_Var3 * 11.0 + 1.0);
  if ((dVar4 != 5.0) || (NAN(dVar4))) {
    __assert_fail("numeric_limits<half>::max_digits10 == std::ceil (numeric_limits<half>::digits * std::log10 (2) + 1)"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testLimits.cpp"
                  ,0x69,"void testLimits()");
  }
  std::operator<<((ostream *)&std::cout,"lowest\n");
  std::numeric_limits<Imath_3_2::half>::lowest();
  fVar2 = Imath_3_2::half::operator_cast_to_float(in_stack_fffffffffffffff0);
  if ((fVar2 == -65504.0) && (!NAN(fVar2))) {
    this = std::operator<<((ostream *)&std::cout,"ok\n\n");
    std::ostream::operator<<(this,std::flush<char,std::char_traits<char>>);
    return;
  }
  __assert_fail("numeric_limits<half>::lowest () == -HALF_MAX",
                "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testLimits.cpp"
                ,0x6c,"void testLimits()");
}

Assistant:

void
testLimits ()
{
    cout << "values in std::numeric_limits<half>\n";

    cout << "min_exponent\n";

    {
        half h (mypow (2, numeric_limits<half>::min_exponent - 1));
        assert (h.isNormalized ());
    }

    {
        half h (mypow (2, numeric_limits<half>::min_exponent - 2));
        assert (h.isDenormalized ());
    }

    cout << "max_exponent\n";

    {
        half h (mypow (2, numeric_limits<half>::max_exponent - 1));
        assert (h.isNormalized ());
    }

    {
        half h (mypow (2, numeric_limits<half>::max_exponent));
        assert (h.isInfinity ());
    }

    cout << "min_exponent10\n";

    {
        half h (mypow (10, numeric_limits<half>::min_exponent10));
        assert (h.isNormalized ());
    }

    {
        half h (mypow (10, numeric_limits<half>::min_exponent10 - 1));
        assert (h.isDenormalized ());
    }

    cout << "max_exponent10\n";

    {
        half h (mypow (10, numeric_limits<half>::max_exponent10));
        assert (h.isNormalized ());
    }

    {
        half h (mypow (10, numeric_limits<half>::max_exponent10 + 1));
        assert (h.isInfinity ());
    }

#if __cplusplus >= 201103L

    cout << "max_digits10\n";
    assert (
        numeric_limits<half>::max_digits10 ==
        std::ceil (numeric_limits<half>::digits * std::log10 (2) + 1));

    cout << "lowest\n";
    assert (numeric_limits<half>::lowest () == -HALF_MAX);

#endif

    cout << "ok\n\n" << flush;
}